

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  ushort uVar1;
  long lVar2;
  RtreeNode *pNode_00;
  int iVar3;
  uint iCell;
  long in_FS_OFFSET;
  RtreeCell cell;
  RtreeCell box;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pNode_00 = pNode->pParent;
  if (pNode_00 == (RtreeNode *)0x0) {
    iVar3 = 0;
  }
  else {
    uVar1 = *(ushort *)(pNode->zData + 2);
    box.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    box.aCoord[0].i = -1;
    box.aCoord[1].i = -1;
    box.aCoord[2].i = -1;
    box.aCoord[3].i = -1;
    box.aCoord[4].i = -1;
    box.aCoord[5].i = -1;
    box.aCoord[6].i = -1;
    box.aCoord[7].i = -1;
    box.aCoord[8] = (RtreeCoord)0xffffffff;
    box.aCoord[9] = (RtreeCoord)0xffffffff;
    nodeGetCell(pRtree,pNode,0,&box);
    for (iCell = 1; iCell < (ushort)(uVar1 << 8 | uVar1 >> 8); iCell = iCell + 1) {
      cell.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
      cell.aCoord[4].i = -1;
      cell.aCoord[5].i = -1;
      cell.aCoord[6].i = -1;
      cell.aCoord[7].i = -1;
      cell.aCoord[0].i = -1;
      cell.aCoord[1].i = -1;
      cell.aCoord[2].i = -1;
      cell.aCoord[3].i = -1;
      cell.aCoord[8] = (RtreeCoord)0xffffffff;
      cell.aCoord[9] = (RtreeCoord)0xffffffff;
      nodeGetCell(pRtree,pNode,iCell,&cell);
      cellUnion(pRtree,&box,&cell);
    }
    cell.iRowid = CONCAT44(cell.iRowid._4_4_,iCell);
    box.iRowid = pNode->iNode;
    iVar3 = nodeParentIndex(pRtree,pNode,(int *)&cell);
    if (iVar3 == 0) {
      nodeOverwriteCell(pRtree,pNode_00,&box,(int)cell.iRowid);
      iVar3 = fixBoundingBox(pRtree,pNode_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK;
  if( pParent ){
    int ii;
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}